

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

section * __thiscall ELFIO::elfio::create_section(elfio *this)

{
  section_impl<ELFIO::Elf64_Shdr> *this_00;
  section_impl<ELFIO::Elf32_Shdr> *this_01;
  reference this_02;
  pointer psVar1;
  size_type sVar2;
  section_impl<ELFIO::Elf32_Shdr> *local_98;
  section_impl<ELFIO::Elf64_Shdr> *local_80;
  short local_6a;
  pointer local_68;
  section *new_section;
  section_impl<ELFIO::Elf32_Shdr> *local_58;
  section_impl<ELFIO::Elf32_Shdr> *local_50 [3];
  undefined1 local_31;
  section_impl<ELFIO::Elf64_Shdr> *local_30;
  section_impl<ELFIO::Elf64_Shdr> *local_28;
  uchar local_19;
  elfio *peStack_18;
  uchar file_class;
  elfio *this_local;
  
  peStack_18 = this;
  local_19 = get_class(this);
  if (local_19 == '\x02') {
    this_00 = (section_impl<ELFIO::Elf64_Shdr> *)operator_new(0xc0,(nothrow_t *)&std::nothrow);
    local_31 = 0;
    local_80 = (section_impl<ELFIO::Elf64_Shdr> *)0x0;
    if (this_00 != (section_impl<ELFIO::Elf64_Shdr> *)0x0) {
      local_31 = 1;
      local_30 = this_00;
      section_impl<ELFIO::Elf64_Shdr>::section_impl
                (this_00,&this->convertor,&this->addr_translator,&this->compression);
      local_80 = this_00;
    }
    local_28 = local_80;
    std::
    vector<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>,std::allocator<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>>>
    ::emplace_back<ELFIO::section_impl<ELFIO::Elf64_Shdr>*>
              ((vector<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>,std::allocator<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>>>
                *)&this->sections_,&local_28);
  }
  else {
    if (local_19 != '\x01') {
      std::
      vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
      ::pop_back(&this->sections_);
      return (section *)0x0;
    }
    this_01 = (section_impl<ELFIO::Elf32_Shdr> *)operator_new(0xa8,(nothrow_t *)&std::nothrow);
    new_section._7_1_ = 0;
    local_98 = (section_impl<ELFIO::Elf32_Shdr> *)0x0;
    if (this_01 != (section_impl<ELFIO::Elf32_Shdr> *)0x0) {
      new_section._7_1_ = 1;
      local_58 = this_01;
      section_impl<ELFIO::Elf32_Shdr>::section_impl
                (this_01,&this->convertor,&this->addr_translator,&this->compression);
      local_98 = this_01;
    }
    local_50[0] = local_98;
    std::
    vector<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>,std::allocator<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>>>
    ::emplace_back<ELFIO::section_impl<ELFIO::Elf32_Shdr>*>
              ((vector<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>,std::allocator<std::unique_ptr<ELFIO::section,std::default_delete<ELFIO::section>>>>
                *)&this->sections_,local_50);
  }
  this_02 = std::
            vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
            ::back(&this->sections_);
  psVar1 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::get(this_02);
  local_68 = psVar1;
  sVar2 = std::
          vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
          ::size(&this->sections_);
  local_6a = (short)sVar2 + -1;
  (*psVar1->_vptr_section[0x23])(psVar1,&local_6a);
  return local_68;
}

Assistant:

section* create_section()
    {
        if ( auto file_class = get_class(); file_class == ELFCLASS64 ) {
            sections_.emplace_back(
                new ( std::nothrow ) section_impl<Elf64_Shdr>(
                    &convertor, &addr_translator, compression ) );
        }
        else if ( file_class == ELFCLASS32 ) {
            sections_.emplace_back(
                new ( std::nothrow ) section_impl<Elf32_Shdr>(
                    &convertor, &addr_translator, compression ) );
        }
        else {
            sections_.pop_back();
            return nullptr;
        }

        section* new_section = sections_.back().get();
        new_section->set_index( static_cast<Elf_Half>( sections_.size() - 1 ) );

        return new_section;
    }